

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_std::time_put_from_base<char>::do_put
          (time_put_from_base<char> *this,iter_type out,ios_base *param_3,char fill,tm *tm,
          char format,char modifier)

{
  time_put *ptVar1;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char in_R8B;
  undefined8 in_R9;
  iter_type iVar2;
  char in_stack_00000008;
  char in_stack_00000010;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  locale local_1d0;
  long local_1c8 [49];
  undefined8 local_40;
  char local_31;
  undefined8 local_20;
  undefined4 uStack_18;
  streambuf_type *local_10;
  undefined1 local_8;
  
  uStack_18 = CONCAT31(uStack_18._1_3_,in_DL);
  local_40 = in_R9;
  local_31 = in_R8B;
  local_20 = in_RSI;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  std::ios::imbue(&local_1d0);
  std::locale::~locale(&local_1d0);
  ptVar1 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     ((locale *)(in_RDI + 0x10));
  local_10 = (streambuf_type *)
             std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
                       (ptVar1,local_20,uStack_18,(long)local_1c8 + *(long *)(local_1c8[0] + -0x18),
                        (int)local_31,local_40,(int)in_stack_00000008,(int)in_stack_00000010);
  local_8 = extraout_DL;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  iVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar2._M_failed = (bool)local_8;
  iVar2._M_sbuf = local_10;
  return iVar2;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType fill,std::tm const *tm,char format,char modifier) const
    {
        std::basic_stringstream<CharType> ss;
        ss.imbue(base_);
        return std::use_facet<std::time_put<CharType> >(base_).put(out,ss,fill,tm,format,modifier);
    }